

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::TestSuite::Run(TestSuite *this)

{
  bool bVar1;
  int iVar2;
  UnitTestImpl *this_00;
  TestEventListeners *this_01;
  TestEventListener *pTVar3;
  OsStackTraceGetterInterface *pOVar4;
  TimeInMillis TVar5;
  TestInfo *this_02;
  TestSuite *in_RDI;
  int j;
  int i;
  char *in_stack_00000038;
  TestEventListener *repeater;
  UnitTestImpl *impl;
  UnitTestImpl *in_stack_ffffffffffffffc0;
  int local_30;
  int local_2c;
  
  if ((in_RDI->should_run_ & 1U) == 0) {
    return;
  }
  this_00 = internal::GetUnitTestImpl();
  internal::UnitTestImpl::set_current_test_suite(this_00,in_RDI);
  UnitTest::GetInstance();
  this_01 = UnitTest::listeners((UnitTest *)0x135a24);
  pTVar3 = TestEventListeners::repeater(this_01);
  (*pTVar3->_vptr_TestEventListener[6])(pTVar3,in_RDI);
  (*pTVar3->_vptr_TestEventListener[7])(pTVar3,in_RDI);
  pOVar4 = internal::UnitTestImpl::os_stack_trace_getter(in_stack_ffffffffffffffc0);
  (*pOVar4->_vptr_OsStackTraceGetterInterface[3])();
  internal::HandleExceptionsInMethodIfSupported<testing::TestSuite,void>
            (this,(offset_in_TestSuite_to_subr)repeater,in_stack_00000038);
  TVar5 = internal::GetTimeInMillis();
  in_RDI->start_timestamp_ = TVar5;
  for (local_2c = 0; iVar2 = total_test_count((TestSuite *)0x135ac8), local_2c < iVar2;
      local_2c = local_2c + 1) {
    GetMutableTestInfo((TestSuite *)in_stack_ffffffffffffffc0,(int)((ulong)in_RDI >> 0x20));
    TestInfo::Run((TestInfo *)this_00);
    if ((FLAGS_gtest_fail_fast & 1) != 0) {
      this_02 = GetMutableTestInfo((TestSuite *)in_stack_ffffffffffffffc0,
                                   (int)((ulong)in_RDI >> 0x20));
      TestInfo::result(this_02);
      bVar1 = TestResult::Failed((TestResult *)in_RDI);
      local_30 = local_2c;
      if (bVar1) goto LAB_00135b24;
    }
  }
LAB_00135b77:
  TVar5 = internal::GetTimeInMillis();
  in_RDI->elapsed_time_ = TVar5 - in_RDI->start_timestamp_;
  pOVar4 = internal::UnitTestImpl::os_stack_trace_getter(in_stack_ffffffffffffffc0);
  (*pOVar4->_vptr_OsStackTraceGetterInterface[3])();
  internal::HandleExceptionsInMethodIfSupported<testing::TestSuite,void>
            (this,(offset_in_TestSuite_to_subr)repeater,in_stack_00000038);
  (*pTVar3->_vptr_TestEventListener[0xb])(pTVar3,in_RDI);
  (*pTVar3->_vptr_TestEventListener[0xc])(pTVar3,in_RDI);
  internal::UnitTestImpl::set_current_test_suite(this_00,(TestSuite *)0x0);
  return;
LAB_00135b24:
  while( true ) {
    local_30 = local_30 + 1;
    iVar2 = total_test_count((TestSuite *)0x135b36);
    if (iVar2 <= local_30) break;
    GetMutableTestInfo((TestSuite *)in_stack_ffffffffffffffc0,(int)((ulong)in_RDI >> 0x20));
    TestInfo::Skip((TestInfo *)this);
  }
  goto LAB_00135b77;
}

Assistant:

void TestSuite::Run() {
  if (!should_run_) return;

  internal::UnitTestImpl* const impl = internal::GetUnitTestImpl();
  impl->set_current_test_suite(this);

  TestEventListener* repeater = UnitTest::GetInstance()->listeners().repeater();

  // Call both legacy and the new API
  repeater->OnTestSuiteStart(*this);
//  Legacy API is deprecated but still available
#ifndef GTEST_REMOVE_LEGACY_TEST_CASEAPI
  repeater->OnTestCaseStart(*this);
#endif  //  GTEST_REMOVE_LEGACY_TEST_CASEAPI

  impl->os_stack_trace_getter()->UponLeavingGTest();
  internal::HandleExceptionsInMethodIfSupported(
      this, &TestSuite::RunSetUpTestSuite, "SetUpTestSuite()");

  start_timestamp_ = internal::GetTimeInMillis();
  for (int i = 0; i < total_test_count(); i++) {
    GetMutableTestInfo(i)->Run();
    if (GTEST_FLAG(fail_fast) && GetMutableTestInfo(i)->result()->Failed()) {
      for (int j = i + 1; j < total_test_count(); j++) {
        GetMutableTestInfo(j)->Skip();
      }
      break;
    }
  }
  elapsed_time_ = internal::GetTimeInMillis() - start_timestamp_;

  impl->os_stack_trace_getter()->UponLeavingGTest();
  internal::HandleExceptionsInMethodIfSupported(
      this, &TestSuite::RunTearDownTestSuite, "TearDownTestSuite()");

  // Call both legacy and the new API
  repeater->OnTestSuiteEnd(*this);
//  Legacy API is deprecated but still available
#ifndef GTEST_REMOVE_LEGACY_TEST_CASEAPI
  repeater->OnTestCaseEnd(*this);
#endif  //  GTEST_REMOVE_LEGACY_TEST_CASEAPI

  impl->set_current_test_suite(nullptr);
}